

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O2

string * __thiscall
cmFindLibraryCommand::FindFrameworkLibraryDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  string *psVar4;
  pointer pbVar5;
  pointer pbVar6;
  string fwPath;
  allocator<char> local_61;
  string *local_60;
  cmFindLibraryCommand *local_58;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar6 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = __return_storage_ptr__;
  local_58 = this;
  do {
    psVar4 = local_60;
    if (pbVar6 == pbVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"",&local_61);
LAB_0017d19b:
      std::__cxx11::string::~string((string *)&local_50);
      return psVar4;
    }
    pbVar5 = (local_58->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (local_58->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while (pbVar5 != pbVar2) {
      std::__cxx11::string::_M_assign((string *)&local_50);
      std::__cxx11::string::append((string *)&local_50);
      std::__cxx11::string::append((char *)&local_50);
      bVar3 = cmsys::SystemTools::FileIsDirectory(&local_50);
      psVar4 = local_60;
      pbVar5 = pbVar5 + 1;
      if (bVar3) {
        cmsys::SystemTools::CollapseFullPath(local_60,&local_50);
        goto LAB_0017d19b;
      }
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

std::string cmFindLibraryCommand::FindFrameworkLibraryDirsPerName()
{
  std::string fwPath;
  // Search for each name in all search paths.
  for (std::string const& n : this->Names) {
    for (std::string const& d : this->SearchPaths) {
      fwPath = d;
      fwPath += n;
      fwPath += ".framework";
      if (cmSystemTools::FileIsDirectory(fwPath)) {
        return cmSystemTools::CollapseFullPath(fwPath);
      }
    }
  }

  // No framework found.
  return "";
}